

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

FILE * mg_fopen(char *path,char *mode)

{
  FILE *pFVar1;
  
  pFVar1 = fopen64(path,mode);
  return (FILE *)pFVar1;
}

Assistant:

FILE *mg_fopen(const char *path, const char *mode) {
#ifdef _WIN32
                                                                                                                            wchar_t wpath[MAX_PATH_SIZE], wmode[10];
  to_wchar(path, wpath, ARRAY_SIZE(wpath));
  to_wchar(mode, wmode, ARRAY_SIZE(wmode));
  return _wfopen(wpath, wmode);
#else
    return fopen(path, mode);
#endif
}